

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::preserveObjectStreams(QPDFWriter *this)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  QPDFObjGen og;
  QPDFObjGen og_00;
  int iVar3;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *pmVar4;
  Object *pOVar5;
  _Base_ptr p_Var6;
  const_iterator iter;
  reference rVar7;
  vector<bool,_std::allocator<bool>_> eligible;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  pmVar4 = QPDF::getXRefTableInternal
                     (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->pdf);
  p_Var1 = &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar2->obj).streams_empty = true;
  p_Var6 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (peVar2->preserve_unreferenced_objects == false) {
    for (; (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6))
    {
      iVar3 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var6[1]._M_parent);
      if (iVar3 == 2) {
        peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (peVar2->obj).streams_empty = false;
        QPDF::getCompressibleObjSet((vector<bool,_std::allocator<bool>_> *)&local_58,peVar2->pdf);
        for (p_Var6 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)
            ) {
          iVar3 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var6[1]._M_parent);
          if (((iVar3 == 2) &&
              ((ulong)(long)(int)p_Var6[1]._M_color <
               (ulong)local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                      _M_offset +
               ((long)local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                      _M_p -
               (long)local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                     _M_p) * 8)) &&
             (rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)&local_58,
                                 (long)(int)p_Var6[1]._M_color), (*rVar7._M_p & rVar7._M_mask) != 0)
             ) {
            iVar3 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)&p_Var6[1]._M_parent);
            og_00.obj = p_Var6[1]._M_color;
            og_00.gen = *(int *)&p_Var6[1].field_0x4;
            pOVar5 = ObjTable<QPDFWriter::Object>::operator[]
                               (&(((this->m).
                                   super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->obj).super_ObjTable<QPDFWriter::Object>,og_00);
            pOVar5->object_stream = iVar3;
          }
        }
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
        return;
      }
    }
  }
  else {
    for (; (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6))
    {
      iVar3 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var6[1]._M_parent);
      if (iVar3 == 2) {
        (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->obj
        ).streams_empty = false;
        iVar3 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)&p_Var6[1]._M_parent);
        og.obj = p_Var6[1]._M_color;
        og.gen = *(int *)&p_Var6[1].field_0x4;
        pOVar5 = ObjTable<QPDFWriter::Object>::operator[]
                           (&(((this->m).
                               super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->obj).super_ObjTable<QPDFWriter::Object>,og);
        pOVar5->object_stream = iVar3;
      }
    }
  }
  return;
}

Assistant:

void
QPDFWriter::preserveObjectStreams()
{
    auto const& xref = QPDF::Writer::getXRefTable(m->pdf);
    // Our object_to_object_stream map has to map ObjGen -> ObjGen since we may be generating object
    // streams out of old objects that have generation numbers greater than zero. However in an
    // existing PDF, all object stream objects and all objects in them must have generation 0
    // because the PDF spec does not provide any way to do otherwise. This code filters out objects
    // that are not allowed to be in object streams. In addition to removing objects that were
    // erroneously included in object streams in the source PDF, it also prevents unreferenced
    // objects from being included.
    auto end = xref.cend();
    m->obj.streams_empty = true;
    if (m->preserve_unreferenced_objects) {
        for (auto iter = xref.cbegin(); iter != end; ++iter) {
            if (iter->second.getType() == 2) {
                // Pdf contains object streams.
                QTC::TC("qpdf", "QPDFWriter preserve object streams preserve unreferenced");
                m->obj.streams_empty = false;
                m->obj[iter->first].object_stream = iter->second.getObjStreamNumber();
            }
        }
    } else {
        // Start by scanning for first compressed object in case we don't have any object streams to
        // process.
        for (auto iter = xref.cbegin(); iter != end; ++iter) {
            if (iter->second.getType() == 2) {
                // Pdf contains object streams.
                QTC::TC("qpdf", "QPDFWriter preserve object streams");
                m->obj.streams_empty = false;
                auto eligible = QPDF::Writer::getCompressibleObjSet(m->pdf);
                // The object pointed to by iter may be a previous generation, in which case it is
                // removed by getCompressibleObjSet. We need to restart the loop (while the object
                // table may contain multiple generations of an object).
                for (iter = xref.cbegin(); iter != end; ++iter) {
                    if (iter->second.getType() == 2) {
                        auto id = static_cast<size_t>(iter->first.getObj());
                        if (id < eligible.size() && eligible[id]) {
                            m->obj[iter->first].object_stream = iter->second.getObjStreamNumber();
                        } else {
                            QTC::TC("qpdf", "QPDFWriter exclude from object stream");
                        }
                    }
                }
                return;
            }
        }
    }
}